

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void aux_rawset(lua_State *L,int idx,TValue *key,int n)

{
  Table *t_00;
  Table *t;
  int n_local;
  TValue *key_local;
  int idx_local;
  lua_State *L_local;
  
  t_00 = gettable(L,idx);
  luaH_set(L,t_00,key,(TValue *)((L->top).offset + -0x10));
  t_00->flags = t_00->flags & 0xc0;
  if ((((*(byte *)((L->top).offset + -8) & 0x40) != 0) && ((t_00->marked & 0x20) != 0)) &&
     ((*(byte *)(*(long *)((L->top).offset + -0x10) + 9) & 0x18) != 0)) {
    luaC_barrierback_(L,(GCObject *)t_00);
  }
  (L->top).p = (L->top).p + -(long)n;
  return;
}

Assistant:

static void aux_rawset (lua_State *L, int idx, TValue *key, int n) {
  Table *t;
  lua_lock(L);
  api_checknelems(L, n);
  t = gettable(L, idx);
  luaH_set(L, t, key, s2v(L->top.p - 1));
  invalidateTMcache(t);
  luaC_barrierback(L, obj2gco(t), s2v(L->top.p - 1));
  L->top.p -= n;
  lua_unlock(L);
}